

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

string * __thiscall
soul::CompileMessage::getFullDescription_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  string filename;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  CodeLocation::getFilename_abi_cxx11_(&local_78,&this->location);
  if (local_78._M_string_length == 0) {
    getFullDescriptionWithoutFilename_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    if ((this->location).location.data != (char *)0x0) {
      getPositionString_abi_cxx11_(&sStack_b8,this);
      std::operator+(&local_98,":",&sStack_b8);
      std::__cxx11::string::append((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&sStack_b8);
    }
    std::operator+(&local_38,&local_78,": ");
    getSeverity_abi_cxx11_(&local_58,this);
    std::operator+(&sStack_b8,&local_38,&local_58);
    std::operator+(&local_98,&sStack_b8,": ");
    std::operator+(__return_storage_ptr__,&local_98,&this->description);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescription() const
{
    auto filename = location.getFilename();

    if (filename.empty())
        return getFullDescriptionWithoutFilename();

    if (hasPosition())
        filename += ":" + getPositionString();

    return filename + ": " + getSeverity() + ": " + description;
}